

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialMotionVector.cpp
# Opt level: O3

Matrix6x6 * __thiscall
iDynTree::SpatialMotionVector::asCrossProductMatrixWrench(SpatialMotionVector *this)

{
  undefined8 *puVar1;
  double dVar2;
  undefined4 uVar3;
  uint uVar4;
  double *pdVar5;
  undefined8 uVar6;
  long lVar7;
  Matrix6x6 *in_RDI;
  uint uVar8;
  double local_48 [2];
  undefined4 uStack_38;
  uint uStack_34;
  double local_30;
  undefined8 local_28;
  undefined4 local_20;
  uint uStack_1c;
  undefined4 uStack_18;
  uint uStack_14;
  undefined4 local_10;
  uint uStack_c;
  undefined8 local_8;
  
  dVar2 = (this->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.
          m_data[2];
  uVar3 = *(undefined4 *)
           (this->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.
           m_data;
  uVar4 = *(uint *)((long)(this->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
                          super_Vector3.m_data + 4);
  uStack_38 = *(undefined4 *)
               ((this->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3
                .m_data + 1);
  uStack_34 = *(uint *)((long)(this->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3
                              .super_Vector3.m_data + 0xc);
  uVar8 = uStack_34 ^ 0x80000000;
  lVar7 = 0;
  local_48[0] = 0.0;
  local_48[1] = -dVar2;
  local_30 = dVar2;
  local_28 = 0;
  local_20 = uVar3;
  uStack_1c = uVar4 ^ 0x80000000;
  uStack_18 = uStack_38;
  uStack_14 = uVar8;
  local_10 = uVar3;
  uStack_c = uVar4;
  local_8 = 0;
  do {
    uVar6 = *(undefined8 *)((long)local_48 + lVar7 + 8);
    puVar1 = (undefined8 *)((long)in_RDI->m_data + lVar7 * 2);
    *puVar1 = *(undefined8 *)((long)local_48 + lVar7);
    puVar1[1] = uVar6;
    *(undefined8 *)((long)in_RDI->m_data + lVar7 * 2 + 0x10) =
         *(undefined8 *)((long)&uStack_38 + lVar7);
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x48);
  lVar7 = 0x28;
  do {
    puVar1 = (undefined8 *)((long)in_RDI->m_data + lVar7 + -0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)in_RDI->m_data + lVar7) = 0;
    lVar7 = lVar7 + 0x30;
  } while (lVar7 != 0xb8);
  lVar7 = 0;
  local_48[0] = 0.0;
  local_48[1] = -(this->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3
                 .m_data[2];
  local_28 = 0;
  local_20 = *(undefined4 *)
              (this->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.
              m_data;
  uStack_c = *(uint *)((long)(this->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.
                             super_Vector3.m_data + 4);
  pdVar5 = (this->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.
           m_data + 1;
  local_30 = *pdVar5;
  uStack_1c = uStack_c ^ 0x80000000;
  uStack_18 = *(undefined4 *)pdVar5;
  uStack_14 = *(uint *)((long)(this->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.
                              super_Vector3.m_data + 0xc) ^ 0x80000000;
  local_10 = local_20;
  local_8 = 0;
  do {
    uVar6 = *(undefined8 *)((long)local_48 + lVar7 + 8);
    puVar1 = (undefined8 *)((long)in_RDI->m_data + lVar7 * 2 + 0x90);
    *puVar1 = *(undefined8 *)((long)local_48 + lVar7);
    puVar1[1] = uVar6;
    *(undefined8 *)((long)in_RDI->m_data + lVar7 * 2 + 0xa0) =
         *(undefined8 *)((long)&uStack_38 + lVar7);
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x48);
  lVar7 = 0;
  local_48[0] = 0.0;
  local_48[1] = -dVar2;
  local_30 = dVar2;
  local_28 = 0;
  local_20 = uVar3;
  uStack_1c = uVar4 ^ 0x80000000;
  uStack_18 = uStack_38;
  uStack_14 = uVar8;
  local_10 = uVar3;
  uStack_c = uVar4;
  local_8 = 0;
  do {
    uVar6 = *(undefined8 *)((long)local_48 + lVar7 + 8);
    puVar1 = (undefined8 *)((long)in_RDI->m_data + lVar7 * 2 + 0xa8);
    *puVar1 = *(undefined8 *)((long)local_48 + lVar7);
    puVar1[1] = uVar6;
    *(undefined8 *)((long)in_RDI->m_data + lVar7 * 2 + 0xb8) =
         *(undefined8 *)((long)&uStack_38 + lVar7);
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x48);
  return in_RDI;
}

Assistant:

Matrix6x6 SpatialMotionVector::asCrossProductMatrixWrench() const
{
    Matrix6x6 res;

    Eigen::Map< Eigen::Matrix<double,6,6,Eigen::RowMajor> > retEigen(res.data());

    retEigen.block<3,3>(0,0) = skew(toEigen(this->angularVec3));
    retEigen.block<3,3>(0,3).setZero();
    retEigen.block<3,3>(3,0) = skew(toEigen(this->linearVec3));
    retEigen.block<3,3>(3,3) = skew(toEigen(this->angularVec3));

    return res;
}